

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test::TestBody
          (CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test *this)

{
  mapped_type_conflict mVar1;
  uint32_t vout;
  pointer pTVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  char *pcVar6;
  CoinSelectionOption *in_R9;
  pointer utxo;
  pointer hex;
  Amount AVar7;
  AssertHelper local_1f8;
  AssertionResult gtest_ar_7;
  Txid txid;
  AssertHelper local_1c0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount local_148;
  Amount fee;
  AmountMap map_select_value;
  CoinSelectionOption option;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_a);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar4 = 0x5f5db24;
  std::__cxx11::string::~string((string *)&option);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_b);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar4 = 0x14a7184a;
  std::__cxx11::string::~string((string *)&option);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_c);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar4 = 0;
  std::__cxx11::string::~string((string *)&option);
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar7 = cfd::core::Amount::CreateBySatoshiAmount(500);
  local_148.amount_ = AVar7.amount_;
  local_148.ignore_check_ = AVar7.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,2.0);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&exp_dummy_asset_c);
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)kExtCoinSelectElementsTestVector.
                          super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70);
  pTVar2 = kExtCoinSelectElementsTestVector.
           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
         super__Vector_impl_data._M_start;
  for (hex = kExtCoinSelectElementsTestVector.
             super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
             ._M_impl.super__Vector_impl_data._M_start; hex != pTVar2; hex = hex + 1) {
    cfd::core::Txid::Txid(&txid);
    if ((hex->txid)._M_string_length != 0) {
      cfd::core::Txid::Txid((Txid *)&ret,&hex->txid);
      cfd::core::Txid::operator=(&txid,(Txid *)&ret);
      cfd::core::Txid::~Txid((Txid *)&ret);
    }
    vout = hex->vout;
    AVar7 = cfd::core::Amount::CreateBySatoshiAmount(hex->amount);
    ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)AVar7.amount_;
    ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT71(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  AVar7.ignore_check_);
    in_R9 = (CoinSelectionOption *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (&txid,vout,&hex->descriptor,(Amount *)&ret,&hex->asset,(void *)0x0,utxo,(Script *)0x0
              );
    utxo = utxo + 1;
    cfd::core::Txid::~Txid(&txid);
  }
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,
                 &map_target_amount,&utxos,&exp_filter,in_R9,&local_148,&map_select_value,&fee,
                 &map_searched_bnb,(AmountMap *)0x0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&ret,&txid);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid);
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x532,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txid);
  }
  gtest_ar_7._0_8_ =
       ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_1f8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"ret.size()","5",(unsigned_long *)&gtest_ar_7,(int *)&local_1f8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x534,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  if ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x438) {
    gtest_ar_7.success_ = true;
    gtest_ar_7._1_7_ = 0x511f3;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[0].amount","static_cast<int64_t>(85062500)",
               &(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start)->amount,(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x536,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
    gtest_ar_7.success_ = true;
    gtest_ar_7._1_7_ = 0xe3f1;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[1].amount","static_cast<int64_t>(14938590)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[1].amount,(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x537,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
    gtest_ar_7.success_ = true;
    gtest_ar_7._1_7_ = 0x14a61a;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[2].amount","static_cast<int64_t>(346430050)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[2].amount,(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x538,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
    gtest_ar_7.success_ = true;
    gtest_ar_7._1_7_ = 0xb71;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[3].amount","static_cast<int64_t>(750000)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[3].amount,(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x539,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
    gtest_ar_7.success_ = true;
    gtest_ar_7._1_7_ = 0x23e8e;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[4].amount","static_cast<int64_t>(37654200)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[4].amount,(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53a,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_7);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
  }
  gtest_ar_7._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1f8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_select_value.size()","3",(unsigned_long *)&gtest_ar_7,
             (int *)&local_1f8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x53c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1f8.data_._0_4_ = 0x5f5e542;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_a.GetHex()]","100001090",
               pmVar4,(int *)&local_1f8);
    std::__cxx11::string::~string((string *)&txid);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53e,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&txid);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1f8.data_._0_4_ = 0x14b18c12;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_b.GetHex()]","347180050",
               pmVar4,(int *)&local_1f8);
    std::__cxx11::string::~string((string *)&txid);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&txid);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_c);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1f8.data_._0_4_ = 0x23e8eb8;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_c.GetHex()]","37654200",
               pmVar4,(int *)&local_1f8);
    std::__cxx11::string::~string((string *)&txid);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x540,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&txid);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
  }
  gtest_ar_7._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_1f8.data_._0_4_ = 0x398;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txid,"fee.GetSatoshiValue()","920",(long *)&gtest_ar_7,(int *)&local_1f8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x542,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  gtest_ar_7._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1f8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_searched_bnb.size()","3",(unsigned_long *)&gtest_ar_7,
             (int *)&local_1f8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x543,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_7.success_ = *pmVar5;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&txid);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x545,(char *)CONCAT71(txid._vptr_Txid._1_7_,(char)txid._vptr_Txid));
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      std::__cxx11::string::~string((string *)&txid);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1f8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_7._0_8_ = CONCAT71(gtest_ar_7._1_7_,*pmVar5) ^ 1;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&txid);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x546,(char *)CONCAT71(txid._vptr_Txid._1_7_,(char)txid._vptr_Txid));
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      std::__cxx11::string::~string((string *)&txid);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1f8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_c);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    mVar1 = *pmVar5;
    gtest_ar_7._0_8_ = CONCAT71(gtest_ar_7._1_7_,mVar1) ^ 1;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&txid);
    if (mVar1 != false) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_c.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x547,(char *)CONCAT71(txid._vptr_Txid._1_7_,(char)txid._vptr_Txid));
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      std::__cxx11::string::~string((string *)&txid);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1f8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
  }
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_with_multiple_asset_fee_only_target)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99998500;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  map_target_amount[exp_dummy_asset_c.GetHex()] = 0;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_c);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 5);
  if (ret.size() == 5) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(14938590));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[4].amount, static_cast<int64_t>(37654200));
  }
  EXPECT_EQ(map_select_value.size(), 3);
  if (map_select_value.size() == 3) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
    EXPECT_EQ(map_select_value[exp_dummy_asset_c.GetHex()], 37654200);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 920);
  EXPECT_EQ(map_searched_bnb.size(), 3);
  if (map_searched_bnb.size() == 3) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_c.GetHex()]);
  }
}